

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O0

BBox3fa * __thiscall embree::SceneGraph::GroupNode::bounds(GroupNode *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  bool bVar3;
  long in_RSI;
  BBox3fa *in_RDI;
  float fVar4;
  Ref<embree::SceneGraph::Node> *c;
  const_iterator __end2;
  const_iterator __begin2;
  vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
  *__range2;
  BBox3fa *b;
  BBox3fa *this_00;
  BBox3fa *__lhs;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  reference local_1a8;
  Ref<embree::SceneGraph::Node> *local_1a0;
  __normal_iterator<const_embree::Ref<embree::SceneGraph::Node>_*,_std::vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>_>
  local_198;
  long local_190;
  reference local_170;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_144;
  Vec3fa *local_140;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_128;
  undefined1 *local_118;
  undefined1 *local_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 *local_e0;
  undefined8 *local_d0;
  Vec3fa *local_c8;
  undefined8 *local_c0;
  undefined8 *local_b0;
  undefined8 *local_a0;
  undefined1 local_98 [16];
  undefined8 *local_88;
  undefined8 *local_80;
  Vec3fa *local_78;
  undefined8 *local_70;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined1 local_48 [16];
  undefined8 *local_30;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_118 = &pos_inf;
  this_00 = in_RDI;
  __lhs = in_RDI;
  local_158 = std::numeric_limits<float>::infinity();
  *(ulong *)&(in_RDI->lower).field_0 = CONCAT44(local_158,local_158);
  *(ulong *)((long)&(in_RDI->lower).field_0 + 8) = CONCAT44(local_158,local_158);
  local_110 = &neg_inf;
  fStack_154 = local_158;
  fStack_150 = local_158;
  fStack_14c = local_158;
  local_144 = local_158;
  local_140 = &in_RDI->upper;
  fVar4 = std::numeric_limits<float>::infinity();
  local_138 = -fVar4;
  *(ulong *)&(in_RDI->upper).field_0 = CONCAT44(fVar4,fVar4) ^ 0x8000000080000000;
  *(ulong *)((long)&(in_RDI->upper).field_0 + 8) = CONCAT44(fVar4,fVar4) ^ 0x8000000080000000;
  local_190 = in_RSI + 0x68;
  fStack_134 = local_138;
  fStack_130 = local_138;
  fStack_12c = local_138;
  local_128 = local_138;
  local_198._M_current =
       (Ref<embree::SceneGraph::Node> *)
       std::
       vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
       ::begin((vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                *)this_00);
  local_1a0 = (Ref<embree::SceneGraph::Node> *)
              std::
              vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
              ::end((vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                     *)this_00);
  while( true ) {
    bVar3 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_embree::Ref<embree::SceneGraph::Node>_*,_std::vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>_>
                        *)__lhs,(__normal_iterator<const_embree::Ref<embree::SceneGraph::Node>_*,_std::vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>_>
                                 *)this_00);
    if (!bVar3) break;
    local_1a8 = __gnu_cxx::
                __normal_iterator<const_embree::Ref<embree::SceneGraph::Node>_*,_std::vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>_>
                ::operator*(&local_198);
    local_170 = local_1a8;
    (*(local_1a8->ptr->super_RefCount)._vptr_RefCount[10])(&local_1c8);
    local_e0 = &local_1c8;
    local_a0 = &local_f8;
    local_18 = *(undefined8 *)&(this_00->lower).field_0;
    uStack_10 = *(undefined8 *)((long)&(this_00->lower).field_0 + 8);
    auVar1._8_8_ = uStack_1c0;
    auVar1._0_8_ = local_1c8;
    local_98 = minps((undefined1  [16])(this_00->lower).field_0,auVar1);
    local_88 = &local_f8;
    local_f8 = local_98._0_8_;
    uStack_f0 = local_98._8_8_;
    local_c0 = &local_f8;
    *(undefined8 *)&(this_00->lower).field_0 = local_98._0_8_;
    *(undefined8 *)((long)&(this_00->lower).field_0 + 8) = local_98._8_8_;
    local_78 = &this_00->upper;
    local_80 = &local_1b8;
    local_70 = &local_108;
    local_58 = *(undefined8 *)&local_78->field_0;
    uStack_50 = *(undefined8 *)((long)&(this_00->upper).field_0 + 8);
    auVar2._8_8_ = uStack_1b0;
    auVar2._0_8_ = local_1b8;
    local_48 = maxps((undefined1  [16])local_78->field_0,auVar2);
    local_30 = &local_108;
    local_108 = local_48._0_8_;
    uStack_100 = local_48._8_8_;
    local_c8 = &this_00->upper;
    local_d0 = &local_108;
    *(undefined8 *)&local_c8->field_0 = local_48._0_8_;
    *(undefined8 *)((long)&(this_00->upper).field_0 + 8) = local_48._8_8_;
    local_b0 = local_e0;
    __gnu_cxx::
    __normal_iterator<const_embree::Ref<embree::SceneGraph::Node>_*,_std::vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>_>
    ::operator++(&local_198);
  }
  return __lhs;
}

Assistant:

virtual BBox3fa bounds() const
      {
        BBox3fa b = empty;
        for (auto& c : children) b.extend(c->bounds());
        return b;
      }